

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

wstring * __thiscall
jessilib::encode_codepoint_w_abi_cxx11_
          (wstring *__return_storage_ptr__,jessilib *this,char32_t in_codepoint)

{
  char32_t in_codepoint_local;
  wstring *result;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  encode_codepoint<wchar_t>(__return_storage_ptr__,(char32_t)this);
  return __return_storage_ptr__;
}

Assistant:

std::wstring encode_codepoint_w(char32_t in_codepoint) {
	std::wstring result;
	encode_codepoint(result, in_codepoint);
	return result;
}